

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::ElementsAreMatcherImpl<char_const(&)[16]>::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (ElementsAreMatcherImpl<char_const(&)[16]> *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  bool bVar1;
  testing *this_00;
  char *matcher;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  Matcher<const_char_&> local_38;
  ElementsAreMatcherImpl<char_const(&)[16]> *local_20;
  ElementsAreMatcherImpl<const_char_(&)[16]> *this_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  local_20 = this;
  this_local = (ElementsAreMatcherImpl<const_char_(&)[16]> *)last._M_current;
  last_local = first;
  MatcherInterface<const_char_(&)[16]>::MatcherInterface
            ((MatcherInterface<const_char_(&)[16]> *)this);
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_001c7db0;
  std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>::
  vector((vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_> *
         )(this + 8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )&this_local);
    if (!bVar1) break;
    local_40 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator++(&last_local,0);
    this_00 = (testing *)
              __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
              ::operator*(&local_40);
    MatcherCast<char_const&,char>(&local_38,this_00,matcher);
    std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>::
    push_back((vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
               *)(this + 8),&local_38);
    Matcher<const_char_&>::~Matcher(&local_38);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }